

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Response_NACK_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Minefield_Response_NACK_PDU::Decode
          (Minefield_Response_NACK_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  int iVar3;
  byte local_57;
  uchar local_56 [7];
  KUINT8 i;
  KUINT8 ui8Tmp;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Minefield_Response_NACK_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0;
  if ((local_19 & 1) != 0) {
    iVar3 = 0xc;
  }
  if ((uint)KVar1 + iVar3 < 0x1a) {
    local_56[1] = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(this_00,&local_40,2);
    local_56[1] = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->m_vSeqNums);
  Minefield_Header::Decode(&this->super_Minefield_Header,pKStack_18,(bool)(local_19 & 1));
  pKVar2 = DATA_TYPE::operator>>(pKStack_18,(DataTypeBase *)&this->m_ReqID);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8ReqID);
  KDataStream::operator>>(pKVar2,&this->m_ui8NumMisPdus);
  local_56[0] = '\0';
  for (local_57 = 0; local_57 < this->m_ui8NumMisPdus; local_57 = local_57 + 1) {
    KDataStream::operator>>(pKStack_18,local_56);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&this->m_vSeqNums,local_56);
  }
  return;
}

Assistant:

void Minefield_Response_NACK_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < MINEFIELD_RESPONSE_NACK_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vSeqNums.clear();

    Minefield_Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_ReqID
           >> m_ui8ReqID
           >> m_ui8NumMisPdus;

    KUINT8 ui8Tmp = 0;
    for( KUINT8 i = 0; i < m_ui8NumMisPdus; ++i )
    {
        stream >> ui8Tmp;
        m_vSeqNums.push_back( ui8Tmp );
    }
}